

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<std::complex<float>_>::SolveSOR
          (TPZSkylMatrix<std::complex<float>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<float>_> *F,TPZFMatrix<std::complex<float>_> *result,
          TPZFMatrix<std::complex<float>_> *residual,TPZFMatrix<std::complex<float>_> *scratch,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  _ComplexT _Var1;
  complex<float> **ppcVar2;
  complex<float> *pcVar3;
  int64_t iVar4;
  long *in_RCX;
  TPZBaseMatrix *in_RDX;
  long *in_RSI;
  long *in_RDI;
  TPZBaseMatrix *in_R8;
  float fVar5;
  double in_XMM0_Qa;
  TPZFMatrix<std::complex<float>_> *extraout_XMM0_Qa;
  double *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  complex<float> val_3;
  complex<float> *scratchp_1;
  complex<float> *diaglast_3;
  complex<float> *diag_3;
  int64_t offset_3;
  complex<float> *diaglast_2;
  complex<float> *diag_2;
  complex<float> *p_1;
  complex<float> val_2;
  int64_t offset_2;
  complex<float> *diaglast_1;
  complex<float> *diag_1;
  complex<float> *p;
  complex<float> val_1;
  int64_t offset_1;
  int64_t id;
  int64_t lastid;
  complex<float> *scratchp;
  complex<float> *diaglast;
  complex<float> *diag;
  complex<float> val;
  int64_t offset;
  int64_t ic;
  int64_t it;
  int64_t iinc;
  int64_t ilast;
  int64_t ifirst;
  int64_t i;
  int64_t c;
  int64_t r;
  complex<float> over;
  REAL res;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffe48;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffe50;
  complex<float> *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 uVar6;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffe70;
  TPZSavable local_168;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffea0;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffea8;
  complex<float> *local_130;
  complex<float> *local_e8;
  complex<float> local_d8;
  int64_t local_d0;
  long local_c0;
  long local_b8;
  complex<float> *local_b0;
  complex<float> *local_a8;
  complex<float> *local_a0;
  complex<float> local_98;
  int64_t local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  int64_t local_58;
  long local_50;
  complex<float> local_48;
  double local_40;
  double local_38;
  TPZBaseMatrix *local_28;
  long *local_20;
  TPZBaseMatrix *local_18;
  long *local_10;
  
  if (in_R8 == in_RDX) {
    std::operator<<((ostream *)&std::cout,
                    "TPZMatrix::SolveSOR called with residual and F equal, no solution\n");
  }
  else {
    local_40 = *in_stack_00000008 + *in_stack_00000008 + 1.0;
    local_38 = in_XMM0_Qa;
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    if (in_R8 != (TPZBaseMatrix *)0x0) {
      fVar5 = ::Norm(in_stack_fffffffffffffe50);
      local_40 = (double)fVar5;
    }
    if (in_stack_00000010 == 0) {
      (**(code **)(*local_20 + 0x78))();
    }
    std::complex<float>::complex(&local_48,(float)local_38,0.0);
    local_50 = (**(code **)(*in_RDI + 0x60))();
    local_58 = TPZBaseMatrix::Cols(local_18);
    local_68 = 0;
    local_70 = local_50;
    local_78 = 1;
    if (in_stack_00000018 == -1) {
      local_68 = local_50 + -1;
      local_70 = 0;
      local_78 = -1;
    }
    local_80 = 0;
    while( true ) {
      uVar6 = false;
      if (local_80 < *local_10) {
        uVar6 = *in_stack_00000008 <= local_40 && local_40 != *in_stack_00000008;
      }
      if ((bool)uVar6 == false) break;
      local_40 = 0.0;
      TPZFMatrix<std::complex<float>_>::operator=
                (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      for (local_88 = 0; local_88 < local_58; local_88 = local_88 + 1) {
        if (in_stack_00000018 == 1) {
          for (local_60 = local_68; local_60 != local_70; local_60 = local_78 + local_60) {
            local_90 = Size((TPZSkylMatrix<std::complex<float>_> *)
                            CONCAT17(uVar6,in_stack_fffffffffffffe60),
                            (int64_t)in_stack_fffffffffffffe58);
            std::complex<float>::complex(&local_98,0.0,0.0);
            ppcVar2 = TPZVec<std::complex<float>_*>::operator[]
                                ((TPZVec<std::complex<float>_*> *)(in_RDI + 4),local_60);
            local_a8 = *ppcVar2;
            local_b0 = TPZFMatrix<std::complex<float>_>::operator()
                                 (in_stack_fffffffffffffe70,(int64_t)in_RDI,
                                  CONCAT17(uVar6,in_stack_fffffffffffffe60));
            pcVar3 = TPZFMatrix<std::complex<float>_>::operator()
                               (in_stack_fffffffffffffe70,(int64_t)in_RDI,
                                CONCAT17(uVar6,in_stack_fffffffffffffe60));
            local_98._M_value = pcVar3->_M_value;
            ppcVar2 = TPZVec<std::complex<float>_*>::operator[]
                                ((TPZVec<std::complex<float>_*> *)(in_RDI + 4),local_60);
            local_a0 = *ppcVar2 + local_90 + -1;
            local_b8 = (long)local_a0 - (long)local_a8 >> 3;
            for (local_c0 = 0; local_c0 <= local_b8; local_c0 = local_c0 + 1) {
              std::operator*((complex<float> *)in_stack_fffffffffffffe48,(complex<float> *)0x136d9c5
                            );
              std::complex<float>::operator-=
                        ((complex<float> *)CONCAT17(uVar6,in_stack_fffffffffffffe60),
                         in_stack_fffffffffffffe58);
            }
          }
          for (local_60 = local_68; local_60 != local_70; local_60 = local_78 + local_60) {
            local_d0 = Size((TPZSkylMatrix<std::complex<float>_> *)
                            CONCAT17(uVar6,in_stack_fffffffffffffe60),
                            (int64_t)in_stack_fffffffffffffe58);
            pcVar3 = TPZFMatrix<std::complex<float>_>::operator()
                               (in_stack_fffffffffffffe70,(int64_t)in_RDI,
                                CONCAT17(uVar6,in_stack_fffffffffffffe60));
            local_d8._M_value = pcVar3->_M_value;
            TPZFMatrix<std::complex<float>_>::operator()
                      (in_stack_fffffffffffffe70,(int64_t)in_RDI,
                       CONCAT17(uVar6,in_stack_fffffffffffffe60));
            ppcVar2 = TPZVec<std::complex<float>_*>::operator[]
                                ((TPZVec<std::complex<float>_*> *)(in_RDI + 4),local_60);
            local_e8 = *ppcVar2 + local_d0;
            ppcVar2 = TPZVec<std::complex<float>_*>::operator[]
                                ((TPZVec<std::complex<float>_*> *)(in_RDI + 4),local_60);
            pcVar3 = *ppcVar2;
            while (local_e8 = local_e8 + -1, pcVar3 < local_e8) {
              std::operator*((complex<float> *)in_stack_fffffffffffffe48,(complex<float> *)0x136db5a
                            );
              std::complex<float>::operator-=
                        ((complex<float> *)CONCAT17(uVar6,in_stack_fffffffffffffe60),
                         in_stack_fffffffffffffe58);
            }
            in_stack_fffffffffffffe58 = &local_d8;
            std::operator*((complex<float> *)in_stack_fffffffffffffe48,(complex<float> *)0x136db8f);
            fVar5 = std::abs<float>((complex<float> *)in_stack_fffffffffffffe50);
            local_40 = local_40 + (double)fVar5;
            std::operator*((complex<float> *)in_stack_fffffffffffffe48,(complex<float> *)0x136dbd1);
            std::operator/((complex<float> *)in_stack_fffffffffffffe48,(complex<float> *)0x136dbef);
            TPZFMatrix<std::complex<float>_>::operator()
                      (in_stack_fffffffffffffe70,(int64_t)in_RDI,
                       CONCAT17(uVar6,in_stack_fffffffffffffe60));
            std::complex<float>::operator+=
                      ((complex<float> *)CONCAT17(uVar6,in_stack_fffffffffffffe60),
                       in_stack_fffffffffffffe58);
          }
        }
        else {
          for (local_60 = local_68; local_60 != local_70; local_60 = local_78 + local_60) {
            iVar4 = Size((TPZSkylMatrix<std::complex<float>_> *)
                         CONCAT17(uVar6,in_stack_fffffffffffffe60),
                         (int64_t)in_stack_fffffffffffffe58);
            pcVar3 = TPZFMatrix<std::complex<float>_>::operator()
                               (in_stack_fffffffffffffe70,(int64_t)in_RDI,
                                CONCAT17(uVar6,in_stack_fffffffffffffe60));
            _Var1 = pcVar3->_M_value;
            TPZFMatrix<std::complex<float>_>::operator()
                      (in_stack_fffffffffffffe70,(int64_t)in_RDI,
                       CONCAT17(uVar6,in_stack_fffffffffffffe60));
            ppcVar2 = TPZVec<std::complex<float>_*>::operator[]
                                ((TPZVec<std::complex<float>_*> *)(in_RDI + 4),local_60);
            local_130 = *ppcVar2 + iVar4;
            ppcVar2 = TPZVec<std::complex<float>_*>::operator[]
                                ((TPZVec<std::complex<float>_*> *)(in_RDI + 4),local_60);
            pcVar3 = *ppcVar2;
            while (local_130 = local_130 + -1, pcVar3 < local_130) {
              std::operator*((complex<float> *)in_stack_fffffffffffffe48,(complex<float> *)0x136dd7a
                            );
              std::complex<float>::operator-=
                        ((complex<float> *)CONCAT17(uVar6,in_stack_fffffffffffffe60),
                         in_stack_fffffffffffffe58);
            }
            pcVar3 = TPZFMatrix<std::complex<float>_>::operator()
                               (in_stack_fffffffffffffe70,(int64_t)in_RDI,
                                CONCAT17(uVar6,in_stack_fffffffffffffe60));
            pcVar3->_M_value = _Var1;
          }
          for (local_60 = local_68; local_60 != local_70; local_60 = local_78 + local_60) {
            iVar4 = Size((TPZSkylMatrix<std::complex<float>_> *)
                         CONCAT17(uVar6,in_stack_fffffffffffffe60),
                         (int64_t)in_stack_fffffffffffffe58);
            ppcVar2 = TPZVec<std::complex<float>_*>::operator[]
                                ((TPZVec<std::complex<float>_*> *)(in_RDI + 4),local_60);
            in_stack_fffffffffffffe48 = (TPZFMatrix<std::complex<float>_> *)*ppcVar2;
            in_stack_fffffffffffffea0 =
                 (TPZFMatrix<std::complex<float>_> *)
                 TPZFMatrix<std::complex<float>_>::operator()
                           (in_stack_fffffffffffffe70,(int64_t)in_RDI,
                            CONCAT17(uVar6,in_stack_fffffffffffffe60));
            pcVar3 = TPZFMatrix<std::complex<float>_>::operator()
                               (in_stack_fffffffffffffe70,(int64_t)in_RDI,
                                CONCAT17(uVar6,in_stack_fffffffffffffe60));
            local_168._vptr_TPZSavable = (_func_int **)pcVar3->_M_value;
            in_stack_fffffffffffffea8 = in_stack_fffffffffffffe48;
            TPZFMatrix<std::complex<float>_>::operator()
                      (in_stack_fffffffffffffe70,(int64_t)in_RDI,
                       CONCAT17(uVar6,in_stack_fffffffffffffe60));
            std::operator*((complex<float> *)in_stack_fffffffffffffe48,(complex<float> *)0x136deb8);
            in_stack_fffffffffffffe50 = (TPZFMatrix<std::complex<float>_> *)&local_168;
            std::complex<float>::operator-=
                      ((complex<float> *)CONCAT17(uVar6,in_stack_fffffffffffffe60),
                       in_stack_fffffffffffffe58);
            std::operator*((complex<float> *)in_stack_fffffffffffffe48,(complex<float> *)0x136dedf);
            fVar5 = std::abs<float>((complex<float> *)in_stack_fffffffffffffe50);
            local_40 = local_40 + (double)fVar5;
            std::operator*((complex<float> *)in_stack_fffffffffffffe48,(complex<float> *)0x136df1b);
            std::operator/((complex<float> *)in_stack_fffffffffffffe48,(complex<float> *)0x136df30);
            TPZFMatrix<std::complex<float>_>::operator()
                      (in_stack_fffffffffffffe70,(int64_t)in_RDI,
                       CONCAT17(uVar6,in_stack_fffffffffffffe60));
            std::complex<float>::operator+=
                      ((complex<float> *)CONCAT17(uVar6,in_stack_fffffffffffffe60),
                       in_stack_fffffffffffffe58);
            pcVar3 = TPZFMatrix<std::complex<float>_>::operator()
                               (in_stack_fffffffffffffe70,(int64_t)in_RDI,
                                CONCAT17(uVar6,in_stack_fffffffffffffe60));
            local_168._vptr_TPZSavable = (_func_int **)pcVar3->_M_value;
            ppcVar2 = TPZVec<std::complex<float>_*>::operator[]
                                ((TPZVec<std::complex<float>_*> *)(in_RDI + 4),local_60);
            pcVar3 = *ppcVar2 + iVar4;
            while (pcVar3 = pcVar3 + -1, in_stack_fffffffffffffea8 < pcVar3) {
              std::operator*((complex<float> *)in_stack_fffffffffffffe48,(complex<float> *)0x136dfe4
                            );
              in_stack_fffffffffffffea0 =
                   (TPZFMatrix<std::complex<float>_> *)
                   &(in_stack_fffffffffffffea0->super_TPZMatrix<std::complex<float>_>).
                    super_TPZBaseMatrix.fRow;
              in_stack_fffffffffffffe70 = extraout_XMM0_Qa;
              std::complex<float>::operator-=
                        ((complex<float> *)CONCAT17(uVar6,in_stack_fffffffffffffe60),
                         in_stack_fffffffffffffe58);
            }
          }
        }
      }
      local_40 = sqrt(local_40);
      local_80 = local_80 + 1;
    }
    if (local_28 != (TPZBaseMatrix *)0x0) {
      (**(code **)(*in_RDI + 0x140))(in_RDI,local_20,local_18,local_28);
    }
    *local_10 = local_80;
    *in_stack_00000008 = local_40;
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::SolveSOR(int64_t & numiterations,const TPZFMatrix<TVar> &F,
                                   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch,const REAL overrelax,
                                   REAL &tol,const int FromCurrent,const int direction)  {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	REAL res = 2.*tol+1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
    TVar over = overrelax;
	int64_t r = this->Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	if(direction == -1) {
		ifirst = r-1;
		ilast = 0;
		iinc = -1;
	}
	int64_t it;
	for(it=0; it<numiterations && res > tol; it++) {
		res = 0.;
		scratch = F;
		for(int64_t ic=0; ic<c; ic++) {
			if(direction == 1) {
				//
				// compute the upper triangular part first and put into the scractch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val;
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					int64_t lastid = diag-diaglast;
					int64_t id;
					for(id=0; id<=lastid; id++) *(scratchp+id) -= *(diag-id) * val;
					/* codeguard fix
					 while( diag >= diaglast ) *scratchp++ -= *diag-- * val;
					 */
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					res += abs(val*val);
					result(i,ic) += val*over/ (*diag);
				}
			} else {
				//
				// the direction is upward
				//
				// put the lower triangular part of the multiplication into the scratch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					//					res += val*val;
					scratch(i,ic) = val;
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					//	TVar val = scratch(i,ic);
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					//val= result(i,ic);
					TVar val = scratch(i,ic);
					val -= *diaglast * result(i,ic);
					res += abs(val*val);
					val = over * val / *diaglast;
					result(i,ic) += val;
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					while( diag > diaglast ) *scratchp++ -= *diag-- * val;
				}
			}
		}
		res = sqrt(res);
	}
	if(residual) {
		this->Residual(result,F,*residual);
	}
	numiterations = it;
	tol = res;
}